

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_set_property(Integer g_a,char *property)

{
  long lVar1;
  short sVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  Integer *pIVar6;
  Integer IVar7;
  logical lVar8;
  Integer IVar9;
  long lVar10;
  global_array_t *pgVar11;
  C_Integer *pCVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Integer status;
  Integer local_200;
  long local_1f8;
  Integer local_1f0;
  Integer dims [7];
  Integer blk [7];
  Integer pe [7];
  Integer hi [7];
  Integer chunk [7];
  Integer lo [7];
  Integer ld [7];
  
  lVar1 = g_a + 1000;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  pnga_pgroup_sync((long)GA[lVar1].p_handle);
  if (GA[lVar1].property != 0) {
    pnga_error("Cannot set property on an array that already has property set",0);
  }
  iVar5 = strcmp(property,"read_only");
  if (iVar5 != 0) {
    iVar5 = strcmp(property,"read_cache");
    pgVar11 = GA;
    if (iVar5 == 0) {
      GA[lVar1].property = 2;
      pgVar11[lVar1].cache_head = (cache_struct_t *)0x0;
      return;
    }
    pnga_error("Trying to set unknown property",0);
    return;
  }
  if (GA[lVar1].distr_type != 0) {
    pnga_error("Block-cyclic arrays not supported for READ_ONLY",0);
  }
  if (GA[lVar1].p_handle != -1) {
    pnga_error("Arrays on subgroups not supported for READ_ONLY",0);
  }
  pgVar11 = GA;
  sVar2 = GA[lVar1].ndim;
  uVar13 = (uint)sVar2;
  uVar21 = (ulong)uVar13;
  if (sVar2 < 1) {
    iVar5 = 0;
  }
  else {
    uVar14 = 0;
    iVar5 = 0;
    do {
      iVar19 = pgVar11[g_a + 1000].nblock[uVar14];
      pgVar11[g_a + 1000].old_nblock[uVar14] = iVar19;
      pgVar11[g_a + 1000].old_lo[uVar14] = (int)pgVar11[g_a + 1000].lo[uVar14];
      pgVar11[g_a + 1000].old_chunk[uVar14] = (int)pgVar11[g_a + 1000].chunk[uVar14];
      iVar5 = iVar5 + iVar19;
      uVar14 = uVar14 + 1;
    } while (uVar21 != uVar14);
  }
  local_200 = g_a;
  pIVar6 = (Integer *)malloc((long)(int)(iVar5 + 1U) << 3);
  pgVar11[lVar1].old_mapc = pIVar6;
  if (-1 < iVar5) {
    pCVar12 = GA[lVar1].mapc;
    pIVar6 = GA[lVar1].old_mapc;
    uVar14 = 0;
    do {
      pIVar6[uVar14] = pCVar12[uVar14];
      uVar14 = uVar14 + 1;
    } while (iVar5 + 1U != uVar14);
  }
  IVar7 = pnga_create_handle();
  local_1f8 = (long)(int)uVar13;
  pnga_set_data(IVar7,local_1f8,GA[lVar1].dims,(long)GA[lVar1].type);
  pnga_set_pgroup(IVar7,(long)GA[lVar1].p_handle);
  lVar8 = pnga_allocate(IVar7);
  if (lVar8 == 0) {
    pnga_error("Failed to allocate temporary array",0);
  }
  local_1f0 = IVar7;
  pnga_copy(local_200,IVar7);
  GA[lVar1].old_handle = GA[lVar1].p_handle;
  IVar7 = pnga_cluster_nodeid();
  IVar9 = pnga_cluster_nprocs(IVar7);
  IVar7 = pnga_cluster_procid(IVar7,0);
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  GA_Default_Proc_Group = -1;
  ARMCI_Group_get_world((ARMCI_Group *)blk);
  ARMCI_Group_set_default((ARMCI_Group *)blk);
  pIVar6 = (Integer *)malloc(IVar9 * 8);
  auVar4 = _DAT_001b20d0;
  if (0 < IVar9) {
    lVar15 = IVar9 + -1;
    auVar22._8_4_ = (int)lVar15;
    auVar22._0_8_ = lVar15;
    auVar22._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar14 = 0;
    auVar22 = auVar22 ^ _DAT_001b20d0;
    auVar23 = _DAT_001b20c0;
    do {
      auVar24 = auVar23 ^ auVar4;
      if ((bool)(~(auVar24._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar24._0_4_ ||
                  auVar22._4_4_ < auVar24._4_4_) & 1)) {
        pIVar6[uVar14] = uVar14 + IVar7;
      }
      if ((auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_) &&
          auVar24._12_4_ <= auVar22._12_4_) {
        pIVar6[uVar14 + 1] = IVar7 + 1 + uVar14;
      }
      uVar14 = uVar14 + 2;
      lVar15 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 2;
      auVar23._8_8_ = lVar15 + 2;
    } while ((IVar9 + 1U & 0xfffffffffffffffe) != uVar14);
  }
  IVar9 = pnga_pgroup_create(pIVar6,IVar9);
  free(pIVar6);
  IVar7 = local_200;
  pgVar11 = GA;
  iVar5 = (int)IVar9;
  GA[lVar1].p_handle = iVar5;
  pgVar11[lVar1].property = 1;
  if (sVar2 < 1) {
LAB_00165a61:
    ddb_h2(local_1f8,dims,(long)PGRP_LIST[IVar9].map_nproc,0.0,0,blk,pe);
LAB_00165a9a:
    lVar15 = 0;
    pgVar11 = GA;
  }
  else {
    uVar14 = 0;
    do {
      lVar15 = pgVar11[lVar1].dims[uVar14];
      lVar17 = pgVar11[lVar1].chunk[uVar14];
      if (lVar17 != lVar15) {
        lVar17 = -1;
      }
      chunk[uVar14] = lVar17;
      dims[uVar14] = lVar15;
      uVar14 = uVar14 + 1;
    } while (uVar21 != uVar14);
    if (chunk[0] != 0) {
      if (0 < sVar2) {
        uVar14 = 0;
        do {
          lVar15 = dims[uVar14];
          if (chunk[uVar14] < dims[uVar14]) {
            lVar15 = chunk[uVar14];
          }
          blk[uVar14] = lVar15;
          uVar14 = uVar14 + 1;
        } while (uVar21 != uVar14);
        if (0 < sVar2) goto LAB_001658de;
      }
      goto LAB_00165a61;
    }
    if (sVar2 < 1) goto LAB_00165a61;
    memset(blk,0xff,(ulong)(uVar13 * 8));
LAB_001658de:
    uVar14 = 0;
    do {
      if (dims[uVar14] == 1) {
        blk[uVar14] = 1;
      }
      uVar14 = uVar14 + 1;
    } while (uVar21 != uVar14);
    ddb_h2(local_1f8,dims,(long)PGRP_LIST[IVar9].map_nproc,0.0,0,blk,pe);
    if (sVar2 < 1) goto LAB_00165a9a;
    uVar14 = 0;
    pIVar6 = mapALL;
    do {
      lVar15 = chunk[uVar14];
      lVar17 = dims[uVar14];
      if (lVar15 < 2) {
        lVar16 = pe[uVar14];
        lVar17 = lVar17 - (blk[uVar14] + -1) * lVar16;
      }
      else {
        lVar18 = lVar17;
        if (lVar15 < lVar17) {
          lVar18 = lVar15;
        }
        lVar16 = pe[uVar14];
        lVar17 = (1 - blk[uVar14]) * lVar16 + (lVar17 + -1) / lVar18 + 1;
      }
      if ((lVar16 < 1) || (dims[uVar14] < 1)) {
        lVar18 = 0;
      }
      else {
        lVar10 = 0;
        iVar19 = 0;
        do {
          iVar20 = (int)blk[uVar14] - (uint)(lVar17 <= lVar10);
          pIVar6[lVar10] = (long)(iVar19 + 1);
          if (1 < lVar15) {
            lVar16 = dims[uVar14];
            if (lVar15 < dims[uVar14]) {
              lVar16 = lVar15;
            }
            iVar20 = iVar20 * (int)lVar16;
          }
          lVar18 = lVar10 + 1;
          lVar16 = pe[uVar14];
          if (lVar16 <= lVar18) break;
          iVar19 = iVar19 + iVar20;
          lVar10 = lVar10 + 1;
        } while ((long)iVar19 < dims[uVar14]);
      }
      pgVar11 = GA;
      if (lVar16 < lVar18) {
        lVar18 = lVar16;
      }
      pe[uVar14] = lVar18;
      pIVar6 = pIVar6 + lVar18;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar21);
    if (sVar2 < 1) goto LAB_00165a9a;
    uVar14 = 0;
    lVar15 = 0;
    do {
      lVar17 = pe[uVar14];
      pgVar11[IVar7 + 1000].nblock[uVar14] = (int)lVar17;
      lVar15 = lVar15 + lVar17;
      uVar14 = uVar14 + 1;
    } while (uVar21 != uVar14);
  }
  free(pgVar11[lVar1].mapc);
  pCVar12 = (C_Integer *)malloc(lVar15 * 8 + 8);
  GA[lVar1].mapc = pCVar12;
  pIVar6 = mapALL;
  pgVar11 = GA;
  if (lVar15 < 1) {
    pCVar12 = GA[lVar1].mapc;
  }
  else {
    pCVar12 = GA[lVar1].mapc;
    lVar17 = 0;
    do {
      pCVar12[lVar17] = pIVar6[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar15 != lVar17);
  }
  pCVar12[lVar15] = -1;
  if (0 < sVar2) {
    uVar14 = 0;
    do {
      pgVar11[IVar7 + 1000].scale[uVar14] =
           (double)pgVar11[IVar7 + 1000].nblock[uVar14] / (double)pgVar11[IVar7 + 1000].dims[uVar14]
      ;
      uVar14 = uVar14 + 1;
    } while (uVar21 != uVar14);
  }
  pnga_distribution(IVar7,GAme,pgVar11[lVar1].lo,hi);
  if (sVar2 < 1) {
    lVar15 = (long)GA[lVar1].elemsize;
  }
  else {
    lVar17 = 1;
    bVar3 = true;
    uVar14 = 0;
    do {
      if (hi[uVar14] < GA[IVar7 + 1000].lo[uVar14]) {
        bVar3 = false;
      }
      lVar17 = lVar17 * ((hi[uVar14] - GA[IVar7 + 1000].lo[uVar14]) + 1);
      uVar14 = uVar14 + 1;
    } while (uVar21 != uVar14);
    lVar15 = 0;
    if (bVar3) {
      lVar15 = lVar17 * GA[lVar1].elemsize;
    }
  }
  lVar17 = GAme;
  if (-1 < IVar9) {
    lVar17 = (long)PGRP_LIST[iVar5].map_proc_list[GAme];
  }
  lVar16 = (long)GA[lVar1].old_handle;
  if (lVar16 < 1) {
    IVar7 = GAme;
    if (-1 < GA[lVar1].old_handle) {
      IVar7 = (Integer)*(int *)(*(long *)((long)&PGRP_LIST->map_proc_list + (lVar16 * 5 << 0x23)) +
                               GAme * 4);
    }
    ARMCI_Free(GA[lVar1].ptr[IVar7] + -GA[lVar1].id);
  }
  else {
    ARMCI_Free_group(GA[lVar1].ptr[PGRP_LIST[lVar16].map_proc_list[GAme]] + -GA[lVar1].id,
                     &PGRP_LIST[lVar16].group);
  }
  lVar16 = GA[lVar1].size;
  if (GA_memory_limited == '\0') {
    GAstat.curmem = GAstat.curmem + (lVar15 - lVar16);
    status = 1;
LAB_00165d28:
    uVar13 = GA[lVar1].mem_dev_set;
    if (uVar13 == 0) {
      iVar5 = gai_get_shmem(GA[lVar1].ptr,lVar15,GA[lVar1].type,&GA[lVar1].id,iVar5);
    }
    else {
      iVar5 = gai_get_devmem((char *)(ulong)uVar13,GA[lVar1].ptr,lVar15,GA[lVar1].type,&GA[lVar1].id
                             ,iVar5,uVar13,GA[lVar1].mem_dev);
    }
    status = (Integer)(iVar5 == 0);
  }
  else {
    GA_total_memory = (GA_total_memory + lVar16) - lVar15;
    GAstat.curmem = (GAstat.curmem - lVar16) + lVar15;
    status = (ulong)~GA_total_memory >> 0x3f;
    IVar7 = pnga_type_f2c(0x3f2);
    pnga_pgroup_gop(IVar9,IVar7,&status,1,"&&");
    if (status != 0) goto LAB_00165d28;
    GA[lVar1].ptr[lVar17] = (char *)0x0;
  }
  GA[lVar1].size = lVar15;
  if (status == 0) {
    pnga_error("Memory failure when unsetting READ_ONLY",0);
  }
  pnga_distribution(local_200,GAme,lo,hi);
  if (0 < sVar2) {
    bVar3 = true;
    uVar14 = 0;
    do {
      ld[uVar14] = (hi[uVar14] - lo[uVar14]) + 1;
      if (hi[uVar14] < lo[uVar14]) {
        bVar3 = false;
      }
      uVar14 = uVar14 + 1;
    } while (uVar21 != uVar14);
    if (!bVar3) goto LAB_00165e32;
  }
  pnga_get(local_1f0,lo,hi,GA[lVar1].ptr[lVar17],ld);
LAB_00165e32:
  pnga_destroy(local_1f0);
  return;
}

Assistant:

void pnga_set_property(Integer g_a, char* property) {
  Integer ga_handle = g_a + GA_OFFSET;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  pnga_pgroup_sync(GA[ga_handle].p_handle);
  /* Check to see if property conflicts with properties already set on the
   * global array. This check may need more refinement as additional properties
   * are added. */
  if (GA[ga_handle].property != NO_PROPERTY) {
    pnga_error("Cannot set property on an array that already has property set",0);
  }
  if (strcmp(property,"read_only")==0) {
    /* TODO: copy global array to new configuration */
    int i, d, ndim, btot, chk;
    Integer nprocs, nodeid, origin_id, dflt_grp, handle, maplen;
    Integer nelem, mem_size, status, grp_me, g_tmp, me_local;
    Integer *list;
    Integer blk[MAXDIM], dims[MAXDIM], pe[MAXDIM], chunk[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM];
    Integer *pmap[MAXDIM], *map;
    char *buf;
    if (GA[ga_handle].distr_type != REGULAR) {
      pnga_error("Block-cyclic arrays not supported for READ_ONLY",0);
    }
    if (GA[ga_handle].p_handle != pnga_pgroup_get_world()) {
      pnga_error("Arrays on subgroups not supported for READ_ONLY",0);
    }
    ndim = (int)GA[ga_handle].ndim;
    btot = 0;
    for (i=0; i<ndim; i++) {
      GA[ga_handle].old_nblock[i] = GA[ga_handle].nblock[i];
      GA[ga_handle].old_lo[i] = GA[ga_handle].lo[i];
      GA[ga_handle].old_chunk[i] = GA[ga_handle].chunk[i];
      btot += GA[ga_handle].nblock[i];
    }
    GA[ga_handle].old_mapc = (Integer*)malloc((btot+1)*sizeof(Integer));
    for (i=0; i<btot+1; i++) {
      GA[ga_handle].old_mapc[i] = GA[ga_handle].mapc[i];
    }
    /* Make a temporary copy of GA */
    g_tmp = pnga_create_handle();
    pnga_set_data(g_tmp,ndim,GA[ga_handle].dims,GA[ga_handle].type);
    pnga_set_pgroup(g_tmp,GA[ga_handle].p_handle);
    if (!pnga_allocate(g_tmp)) {
      pnga_error("Failed to allocate temporary array",0);
    }
    pnga_copy(g_a, g_tmp);
    /* Create a group containing all the processors on this node */
    GA[ga_handle].old_handle = GA[ga_handle].p_handle;
    nodeid = pnga_cluster_nodeid();
    nprocs = pnga_cluster_nprocs(nodeid);
    origin_id = pnga_cluster_procid(nodeid,0);
    dflt_grp = pnga_pgroup_get_default();
    pnga_pgroup_set_default(pnga_pgroup_get_world());
    list = (Integer*)malloc(nprocs*sizeof(Integer));
    for (i=0; i<nprocs; i++) {
      list[i] = origin_id+i;
    }
    handle = pnga_pgroup_create(list, nprocs);
    free(list);
    GA[ga_handle].p_handle = handle;
    GA[ga_handle].property = READ_ONLY;

    /* Ignore hints on data distribution (chunk) and just go with default
     * distribution on the node, except if chunk dimension is same as array
     * dimension (no partitioning on that axis) */
    for (i=0; i<ndim; i++) {
      /* eliminate dimension=1 from analysis, otherwise set blk to -1*/
      if (GA[ga_handle].chunk[i] == GA[ga_handle].dims[i]) {
        chunk[i] = GA[ga_handle].chunk[i];
      } else {
        chunk[i] = -1;
      }
      dims[i] = GA[ga_handle].dims[i];
    }
    if (chunk[0] != 0)
      for (d=0; d<ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for (d=0; d<ndim; d++) blk[d]=-1;
    for (d=0; d<ndim; d++) if (dims[d]==1) blk[d]=1;
    ddb_h2(ndim, dims, PGRP_LIST[handle].map_nproc,0.0,(Integer)0,blk,pe);
    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       * but respect the users block size */

      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      } else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d];
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    free(GA[ga_handle].mapc);
    GA[ga_handle].mapc = (Integer*)malloc((maplen+1)*sizeof(Integer));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
    /* Set remaining paramters and determine memory size if regular data
     * distribution is being used */

    for( i = 0; i< ndim; i++){
      GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
        / (double)GA[ga_handle].dims[i];
    }

    /*** determine which portion of the array I am supposed
     * to hold ***/
    pnga_distribution(g_a, GAme, GA[ga_handle].lo, hi);
    chk = 1;
    for( i = 0, nelem=1; i< ndim; i++){
      if (hi[i]-(Integer)GA[ga_handle].lo[i]+1 <= 0) chk = 0;
      nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1);
    }
    mem_size = nelem * GA[ga_handle].elemsize;
    if (!chk) mem_size = 0;
    grp_me = pnga_pgroup_nodeid(handle);
    /* Clean up old memory first */
#ifndef AVOID_MA_STORAGE
    if(gai_uses_shm((int)handle)){
#endif
      /* make sure that we free original (before address allignment)
       * pointer */
#ifdef MSG_COMMS_MPI
      if (GA[ga_handle].old_handle > 0){
        ARMCI_Free_group(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].old_handle)]
            - GA[ga_handle].id,
            &PGRP_LIST[GA[ga_handle].old_handle].group);
      }
      else
#endif
      {
        ARMCI_Free(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].old_handle)]
            - GA[ga_handle].id);
      }
#ifndef AVOID_MA_STORAGE
    }else{
      if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
    }
#endif

    if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
    GAstat.curmem -= GA[ga_handle].size;
    /* if requested, enforce limits on memory consumption */
    if(GA_memory_limited) GA_total_memory -= mem_size;
    GAstat.curmem += mem_size;
    /* check if everybody has enough memory left */
    if(GA_memory_limited){
      status = (GA_total_memory >= 0) ? 1 : 0;
      pnga_pgroup_gop(handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
    } else status = 1;
    /* allocate memory */
    if (status) {
      /* Allocate new memory */
      if (GA[ga_handle].mem_dev_set) {
        status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, handle,
            GA[ga_handle].mem_dev_set,GA[ga_handle].mem_dev);
      } else {
        status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, handle);
      }
    } else {
      GA[ga_handle].ptr[grp_me]=NULL;
    }
    GA[ga_handle].size = (C_Long)mem_size;
    if (!status) {
      pnga_error("Memory failure when unsetting READ_ONLY",0);
    }
    /* Copy data from copy of old GA to new GA and then get rid of copy*/
    pnga_distribution(g_a,GAme,lo,hi);
    chk = 1;
    nelem = 1;
    for (i=0; i<ndim; i++) {
      /*
      GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
      */
      ld[i] = hi[i] - lo[i] + 1;
      nelem *= ld[i];
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
#if 1
      pnga_get(g_tmp,lo,hi,GA[ga_handle].ptr[grp_me],ld);
#else
      /* MPI RMA does not allow you to use memory assigned to one window as
       * local buffer for another buffer. Create a local buffer to get around
       * this problem */
      buf = (char*)malloc(nelem*GA[ga_handle].elemsize);
      pnga_get(g_tmp,lo,hi,buf,ld);
      memcpy(GA[ga_handle].ptr[grp_me],buf,nelem*GA[ga_handle].elemsize);
      free(buf);
#endif
    }
    pnga_destroy(g_tmp);
  } else if (strcmp(property, "read_cache") == 0) {
    GA[ga_handle].property = READ_CACHE;
    GA[ga_handle].cache_head = NULL; /* (cache_struct_t *)malloc(sizeof(cache_struct_t)) */
  } else {
    pnga_error("Trying to set unknown property",0);
  }
}